

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

char * fy_token_get_direct_output(fy_token *fyt,size_t *sizep)

{
  char *pcVar1;
  
  if (((fyt != (fy_token *)0x0) && (((fyt->handle).field_0x35 & 4) != 0)) &&
     ((fyt->type | FYTT_KEY) != FYTT_TAG)) {
    *sizep = (fyt->handle).end_mark.input_pos - (fyt->handle).start_mark.input_pos;
    pcVar1 = fy_atom_data(&fyt->handle);
    return pcVar1;
  }
  *sizep = 0;
  return (char *)0x0;
}

Assistant:

const char *fy_token_get_direct_output(struct fy_token *fyt, size_t *sizep) {
    const struct fy_atom *fya;

    fya = fy_token_atom(fyt);
    if (!fya || !fya->direct_output ||
        (fyt->type == FYTT_TAG || fyt->type == FYTT_TAG_DIRECTIVE)) {
        *sizep = 0;
        return NULL;
    }
    *sizep = fy_atom_size(fya);
    return fy_atom_data(fya);
}